

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

void __thiscall deqp::gls::VertexArrayTest::compare(VertexArrayTest *this)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  uint uVar5;
  ContextArrayPack *pCVar6;
  ContextArrayPack *pCVar7;
  TestLog *log;
  TextureFormat this_00;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  ulong uVar12;
  Surface *surface;
  Surface *pSVar13;
  ChannelOrder CVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  RGBA thr;
  int iVar19;
  int iVar20;
  ChannelOrder CVar21;
  int iVar22;
  int iVar23;
  _Alloc_hider _Var24;
  int iVar25;
  void *pvVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  Surface error;
  int local_44c;
  string local_438;
  int local_418;
  int local_414;
  string local_410;
  Surface local_3f0;
  string local_3d8;
  string local_3b8;
  Surface *local_398;
  LogImageSet local_390;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  pCVar6 = this->m_rrArrayPack;
  pCVar7 = this->m_glArrayPack;
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (1 < *(int *)(CONCAT44(extraout_var,iVar10) + 0x20)) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
               ,0x8a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
    pvVar26 = (void *)(pCVar6->m_screen).m_pixels.m_cap;
    if (pvVar26 != (void *)0x0) {
      pvVar26 = (pCVar6->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,
               (pCVar6->m_screen).m_width,(pCVar6->m_screen).m_height,1,pvVar26);
    local_240.m_name._M_dataplus._M_p = (pointer)0x300000008;
    pvVar26 = (void *)(pCVar7->m_screen).m_pixels.m_cap;
    if (pvVar26 != (void *)0x0) {
      pvVar26 = (pCVar7->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_2d0,(TextureFormat *)&local_240,
               (pCVar7->m_screen).m_width,(pCVar7->m_screen).m_height,1,pvVar26);
    bVar8 = tcu::fuzzyCompare(log,"Compare Results","Compare Results",
                              (ConstPixelBufferAccess *)local_1b0,
                              (ConstPixelBufferAccess *)&local_2d0,1.5,COMPARE_LOG_RESULT);
    this->m_isOk = bVar8;
    return;
  }
  pSVar13 = &pCVar6->m_screen;
  iVar10 = this->m_maxDiffGreen;
  iVar25 = this->m_maxDiffBlue;
  uVar4 = this->m_maxDiffRed;
  tcu::Surface::Surface(&local_3f0,(pCVar6->m_screen).m_width,(pCVar6->m_screen).m_height);
  this->m_isOk = true;
  if (0 < (pCVar6->m_screen).m_height) {
    thr.m_value = iVar10 << 8 | uVar4 | iVar25 << 0x10 | 0xff000000;
    iVar10 = 0;
    local_44c = -1;
    local_398 = pSVar13;
    do {
      uVar12 = (ulong)(uint)pSVar13->m_width;
      if (0 < pSVar13->m_width) {
        iVar25 = iVar10 + 1;
        lVar28 = 0;
        do {
          iVar27 = (int)lVar28;
          uVar4 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                           (long)((pCVar7->m_screen).m_width * iVar10 + iVar27) * 4);
          if (((iVar10 == 0) || (lVar28 == 0)) || (iVar25 == (pCVar6->m_screen).m_height)) {
LAB_0095cef8:
            *(uint *)((long)local_3f0.m_pixels.m_ptr +
                     (long)(local_3f0.m_width * iVar10 + iVar27) * 4) =
                 ((uVar4 >> 1 & 0x7f80) + 0x7f80 & 0xff00) + (uVar4 & 0xff00ff) + -0x1000000;
          }
          else {
            if (lVar28 + 1U == (uVar12 & 0xffffffff)) goto LAB_0095cef8;
            iVar11 = (int)uVar12 * iVar10;
            pvVar26 = (pCVar6->m_screen).m_pixels.m_ptr;
            uVar5 = *(uint *)((long)pvVar26 + (long)(iVar11 + iVar27) * 4);
            iVar17 = (int)(lVar28 + -1);
            uVar18 = *(uint *)((long)pvVar26 + (long)(iVar11 + iVar17) * 4);
            iVar11 = (int)(lVar28 + 1U);
            if (uVar5 == uVar18) {
LAB_0095d0d0:
              uVar18 = *(uint *)((long)(pCVar6->m_screen).m_pixels.m_ptr +
                                (long)((pCVar6->m_screen).m_width * (iVar10 + -1) + iVar27) * 4);
              bVar8 = true;
              if (uVar5 != uVar18) {
                CVar14 = (uVar5 & 0xff) - (uVar18 & 0xff);
                CVar21 = -CVar14;
                if (0 < (int)CVar14) {
                  CVar21 = CVar14;
                }
                uVar15 = uVar5 >> 8 & 0xff;
                iVar19 = uVar15 - (uVar18 >> 8 & 0xff);
                iVar20 = -iVar19;
                if (0 < iVar19) {
                  iVar20 = iVar19;
                }
                uVar31 = uVar5 >> 0x10 & 0xff;
                iVar22 = uVar31 - (uVar18 >> 0x10 & 0xff);
                iVar19 = -iVar22;
                if (0 < iVar22) {
                  iVar19 = iVar22;
                }
                iVar23 = (uVar5 >> 0x18) - (uVar18 >> 0x18);
                iVar22 = -iVar23;
                if (0 < iVar23) {
                  iVar22 = iVar23;
                }
                local_1b0._0_4_ = iVar19 << 0x10 | iVar20 << 8 | iVar22 << 0x18 | CVar21;
                bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                if (bVar8) {
                  bVar8 = true;
                }
                else {
                  uVar18 = *(uint *)((long)(pCVar6->m_screen).m_pixels.m_ptr +
                                    (long)((pCVar6->m_screen).m_width * iVar25 + iVar27) * 4);
                  bVar8 = true;
                  if (uVar5 != uVar18) {
                    CVar14 = (uVar5 & 0xff) - (uVar18 & 0xff);
                    CVar21 = -CVar14;
                    if (0 < (int)CVar14) {
                      CVar21 = CVar14;
                    }
                    iVar19 = uVar15 - (uVar18 >> 8 & 0xff);
                    iVar20 = -iVar19;
                    if (0 < iVar19) {
                      iVar20 = iVar19;
                    }
                    iVar22 = uVar31 - (uVar18 >> 0x10 & 0xff);
                    iVar19 = -iVar22;
                    if (0 < iVar22) {
                      iVar19 = iVar22;
                    }
                    iVar23 = (uVar5 >> 0x18) - (uVar18 >> 0x18);
                    iVar22 = -iVar23;
                    if (0 < iVar23) {
                      iVar22 = iVar23;
                    }
                    local_1b0._0_4_ = iVar19 << 0x10 | iVar20 << 8 | iVar22 << 0x18 | CVar21;
                    bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                  }
                }
              }
            }
            else {
              CVar14 = (uVar5 & 0xff) - (uVar18 & 0xff);
              CVar21 = -CVar14;
              if (0 < (int)CVar14) {
                CVar21 = CVar14;
              }
              uVar15 = uVar5 >> 8 & 0xff;
              iVar19 = uVar15 - (uVar18 >> 8 & 0xff);
              iVar20 = -iVar19;
              if (0 < iVar19) {
                iVar20 = iVar19;
              }
              uVar31 = uVar5 >> 0x10 & 0xff;
              iVar22 = uVar31 - (uVar18 >> 0x10 & 0xff);
              iVar19 = -iVar22;
              if (0 < iVar22) {
                iVar19 = iVar22;
              }
              iVar23 = (uVar5 >> 0x18) - (uVar18 >> 0x18);
              iVar22 = -iVar23;
              if (0 < iVar23) {
                iVar22 = iVar23;
              }
              local_1b0._0_4_ = iVar19 << 0x10 | iVar20 << 8 | iVar22 << 0x18 | CVar21;
              bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              if ((bVar8) ||
                 (uVar18 = *(uint *)((long)(pCVar6->m_screen).m_pixels.m_ptr +
                                    (long)((pCVar6->m_screen).m_width * iVar10 + iVar11) * 4),
                 uVar5 == uVar18)) goto LAB_0095d0d0;
              CVar14 = (uVar5 & 0xff) - (uVar18 & 0xff);
              CVar21 = -CVar14;
              if (0 < (int)CVar14) {
                CVar21 = CVar14;
              }
              iVar19 = uVar15 - (uVar18 >> 8 & 0xff);
              iVar20 = -iVar19;
              if (0 < iVar19) {
                iVar20 = iVar19;
              }
              iVar22 = uVar31 - (uVar18 >> 0x10 & 0xff);
              iVar19 = -iVar22;
              if (0 < iVar22) {
                iVar19 = iVar22;
              }
              iVar23 = (uVar5 >> 0x18) - (uVar18 >> 0x18);
              iVar22 = -iVar23;
              if (0 < iVar23) {
                iVar22 = iVar23;
              }
              local_1b0._0_4_ = iVar19 << 0x10 | iVar20 << 8 | iVar22 << 0x18 | CVar21;
              bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              if (bVar8) goto LAB_0095d0d0;
              bVar8 = false;
            }
            uVar18 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                              (long)(iVar17 + (pCVar7->m_screen).m_width * iVar10) * 4);
            uVar15 = uVar4 >> 0x10;
            uVar31 = uVar4 >> 0x18;
            if (uVar4 == uVar18) {
LAB_0095d3d2:
              uVar18 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                                (long)((pCVar7->m_screen).m_width * (iVar10 + -1) + iVar27) * 4);
              bVar9 = true;
              if (uVar4 != uVar18) {
                CVar14 = (uVar4 & 0xff) - (uVar18 & 0xff);
                CVar21 = -CVar14;
                if (0 < (int)CVar14) {
                  CVar21 = CVar14;
                }
                uVar16 = uVar4 >> 8 & 0xff;
                iVar17 = uVar16 - (uVar18 >> 8 & 0xff);
                iVar11 = -iVar17;
                if (0 < iVar17) {
                  iVar11 = iVar17;
                }
                iVar20 = (uVar15 & 0xff) - (uVar18 >> 0x10 & 0xff);
                iVar17 = -iVar20;
                if (0 < iVar20) {
                  iVar17 = iVar20;
                }
                iVar19 = uVar31 - (uVar18 >> 0x18);
                iVar20 = -iVar19;
                if (0 < iVar19) {
                  iVar20 = iVar19;
                }
                local_1b0._0_4_ = iVar17 << 0x10 | iVar11 << 8 | iVar20 << 0x18 | CVar21;
                bVar9 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                if (bVar9) {
                  bVar9 = true;
                }
                else {
                  uVar18 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                                    (long)((pCVar7->m_screen).m_width * iVar25 + iVar27) * 4);
                  bVar9 = true;
                  if (uVar4 != uVar18) {
                    CVar14 = (uVar4 & 0xff) - (uVar18 & 0xff);
                    CVar21 = -CVar14;
                    if (0 < (int)CVar14) {
                      CVar21 = CVar14;
                    }
                    iVar17 = uVar16 - (uVar18 >> 8 & 0xff);
                    iVar11 = -iVar17;
                    if (0 < iVar17) {
                      iVar11 = iVar17;
                    }
                    iVar20 = (uVar15 & 0xff) - (uVar18 >> 0x10 & 0xff);
                    iVar17 = -iVar20;
                    if (0 < iVar20) {
                      iVar17 = iVar20;
                    }
                    iVar19 = uVar31 - (uVar18 >> 0x18);
                    iVar20 = -iVar19;
                    if (0 < iVar19) {
                      iVar20 = iVar19;
                    }
                    local_1b0._0_4_ = iVar17 << 0x10 | iVar11 << 8 | iVar20 << 0x18 | CVar21;
                    bVar9 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
                  }
                }
              }
            }
            else {
              CVar14 = (uVar4 & 0xff) - (uVar18 & 0xff);
              CVar21 = -CVar14;
              if (0 < (int)CVar14) {
                CVar21 = CVar14;
              }
              uVar16 = uVar4 >> 8 & 0xff;
              iVar20 = uVar16 - (uVar18 >> 8 & 0xff);
              iVar17 = -iVar20;
              if (0 < iVar20) {
                iVar17 = iVar20;
              }
              iVar19 = (uVar15 & 0xff) - (uVar18 >> 0x10 & 0xff);
              iVar20 = -iVar19;
              if (0 < iVar19) {
                iVar20 = iVar19;
              }
              iVar22 = uVar31 - (uVar18 >> 0x18);
              iVar19 = -iVar22;
              if (0 < iVar22) {
                iVar19 = iVar22;
              }
              local_1b0._0_4_ = iVar20 << 0x10 | iVar17 << 8 | iVar19 << 0x18 | CVar21;
              bVar9 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              if ((bVar9) ||
                 (uVar18 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                                    (long)(iVar11 + (pCVar7->m_screen).m_width * iVar10) * 4),
                 uVar4 == uVar18)) goto LAB_0095d3d2;
              CVar14 = (uVar4 & 0xff) - (uVar18 & 0xff);
              CVar21 = -CVar14;
              if (0 < (int)CVar14) {
                CVar21 = CVar14;
              }
              iVar17 = uVar16 - (uVar18 >> 8 & 0xff);
              iVar11 = -iVar17;
              if (0 < iVar17) {
                iVar11 = iVar17;
              }
              iVar20 = (uVar15 & 0xff) - (uVar18 >> 0x10 & 0xff);
              iVar17 = -iVar20;
              if (0 < iVar20) {
                iVar17 = iVar20;
              }
              iVar19 = uVar31 - (uVar18 >> 0x18);
              iVar20 = -iVar19;
              if (0 < iVar19) {
                iVar20 = iVar19;
              }
              local_1b0._0_4_ = iVar17 << 0x10 | iVar11 << 8 | iVar20 << 0x18 | CVar21;
              bVar9 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              if (bVar9) goto LAB_0095d3d2;
              bVar9 = false;
            }
            if ((bVar8 | bVar9) == 1) {
              bVar8 = false;
              iVar11 = local_44c;
              iVar17 = -1;
              do {
                local_414 = iVar17;
                local_418 = iVar11;
                if (!bVar8) {
                  lVar29 = -1;
                  do {
                    uVar18 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                                      (long)((pCVar7->m_screen).m_width * local_418 + iVar27 +
                                            (int)lVar29) * 4);
                    uVar16 = (uVar5 & 0xff) - (uVar18 & 0xff);
                    uVar31 = -uVar16;
                    if (0 < (int)uVar16) {
                      uVar31 = uVar16;
                    }
                    uVar30 = (uVar5 >> 0x10 & 0xff) - (uVar18 >> 0x10 & 0xff);
                    uVar16 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar16 = uVar30;
                    }
                    if ((int)(uVar31 & 0xff) <= this->m_maxDiffRed) {
                      uVar31 = (uVar5 >> 8 & 0xff) - (uVar18 >> 8 & 0xff);
                      uVar18 = -uVar31;
                      if (0 < (int)uVar31) {
                        uVar18 = uVar31;
                      }
                      if (((int)(uVar18 & 0xff) <= this->m_maxDiffGreen) &&
                         ((int)(uVar16 & 0xff) <= this->m_maxDiffBlue)) {
                        bVar8 = true;
                      }
                    }
                    uVar18 = *(uint *)((long)(pCVar6->m_screen).m_pixels.m_ptr +
                                      (long)((int)lVar29 +
                                            (pCVar6->m_screen).m_width * local_418 + iVar27) * 4);
                    uVar16 = (uVar18 & 0xff) - (uVar4 & 0xff);
                    uVar31 = -uVar16;
                    if (0 < (int)uVar16) {
                      uVar31 = uVar16;
                    }
                    uVar30 = (uVar18 >> 0x10 & 0xff) - (uVar15 & 0xff);
                    uVar16 = -uVar30;
                    if (0 < (int)uVar30) {
                      uVar16 = uVar30;
                    }
                    if ((int)(uVar31 & 0xff) <= this->m_maxDiffRed) {
                      uVar31 = (uVar18 >> 8 & 0xff) - (uVar4 >> 8 & 0xff);
                      uVar18 = -uVar31;
                      if (0 < (int)uVar31) {
                        uVar18 = uVar31;
                      }
                      if (((int)(uVar18 & 0xff) <= this->m_maxDiffGreen) &&
                         ((int)(uVar16 & 0xff) <= this->m_maxDiffBlue)) {
                        bVar8 = true;
                      }
                    }
                  } while ((lVar29 < 1) && (lVar29 = lVar29 + 1, !bVar8));
                }
                if (0 < local_414) break;
                iVar11 = local_418 + 1;
                iVar17 = local_414 + 1;
              } while (!bVar8);
              pSVar13 = local_398;
              if (bVar8) goto LAB_0095d763;
              *(undefined4 *)
               ((long)local_3f0.m_pixels.m_ptr + (long)(local_3f0.m_width * iVar10 + iVar27) * 4) =
                   0xff0000ff;
              this->m_isOk = false;
            }
            else {
LAB_0095d763:
              uVar4 = *(uint *)((long)(pCVar7->m_screen).m_pixels.m_ptr +
                               (long)((pCVar7->m_screen).m_width * iVar10 + iVar27) * 4);
              *(uint *)((long)local_3f0.m_pixels.m_ptr +
                       (long)(local_3f0.m_width * iVar10 + iVar27) * 4) =
                   (uVar4 & 0xff00ff) + ((uVar4 >> 1 & 0x7f80) + 0x7f80 & 0xff00) + -0x1000000;
            }
          }
          lVar28 = lVar28 + 1;
          uVar12 = (ulong)pSVar13->m_width;
        } while (lVar28 < (long)uVar12);
      }
      iVar10 = iVar10 + 1;
      local_44c = local_44c + 1;
    } while (iVar10 < (pCVar6->m_screen).m_height);
  }
  surface = &pCVar7->m_screen;
  this_00 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  CVar21 = this_00.order;
  if (this->m_isOk == false) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Image comparison failed, threshold = (",0x26);
    std::ostream::operator<<(poVar1,this->m_maxDiffRed);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,this->m_maxDiffGreen);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,this->m_maxDiffBlue);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Compare result","");
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Result of rendering","");
    tcu::LogImageSet::LogImageSet(&local_390,&local_410,&local_438);
    tcu::TestLog::startImageSet
              ((TestLog *)this_00,local_390.m_name._M_dataplus._M_p,
               local_390.m_description._M_dataplus._M_p);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Result","");
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"Result","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_3b8,&local_3d8,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,CVar21,__buf_00,(size_t)surface);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Reference","");
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"Reference","");
    tcu::LogImage::LogImage(&local_2d0,&local_2f0,&local_310,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_2d0,CVar21,__buf_01,(size_t)pSVar13);
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"ErrorMask","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Error mask","");
    pSVar13 = &local_3f0;
    tcu::LogImage::LogImage(&local_240,&local_330,&local_350,pSVar13,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_240,CVar21,__buf_02,(size_t)pSVar13);
    tcu::TestLog::endImageSet((TestLog *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390.m_description._M_dataplus._M_p != &local_390.m_description.field_2) {
      operator_delete(local_390.m_description._M_dataplus._M_p,
                      local_390.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390.m_name._M_dataplus._M_p != &local_390.m_name.field_2) {
      operator_delete(local_390.m_name._M_dataplus._M_p,
                      local_390.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    _Var24._M_p = local_410._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p == &local_410.field_2) goto LAB_0095df07;
  }
  else {
    paVar2 = &local_240.m_name.field_2;
    local_240.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Compare result","");
    paVar3 = &local_390.m_name.field_2;
    local_390.m_name._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"Result of rendering","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_2d0,&local_240.m_name,&local_390.m_name);
    tcu::TestLog::startImageSet
              ((TestLog *)this_00,local_2d0.m_name._M_dataplus._M_p,
               local_2d0.m_description._M_dataplus._M_p);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Result","");
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Result","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_410,&local_438,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,CVar21,__buf,(size_t)surface);
    tcu::TestLog::endImageSet((TestLog *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_390.m_name._M_dataplus._M_p,
                      local_390.m_name.field_2._M_allocated_capacity + 1);
    }
    local_410.field_2._M_allocated_capacity = local_240.m_name.field_2._M_allocated_capacity;
    _Var24._M_p = local_240.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p == paVar2) goto LAB_0095df07;
  }
  operator_delete(_Var24._M_p,local_410.field_2._M_allocated_capacity + 1);
LAB_0095df07:
  tcu::Surface::~Surface(&local_3f0);
  return;
}

Assistant:

void VertexArrayTest::compare (void)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		m_isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 1.5f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		tcu::RGBA		threshold	(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 255);
		tcu::Surface	error		(ref.getWidth(), ref.getHeight());

		m_isOk = true;

		for (int y = 0; y < ref.getHeight(); y++)
		{
			for (int x = 0; x < ref.getWidth(); x++)
			{
				tcu::RGBA	refPixel		= ref.getPixel(x, y);
				tcu::RGBA	screenPixel		= screen.getPixel(x, y);
				bool		isOkPixel		= false;

				if (y == 0 || y + 1 == ref.getHeight() || x == 0 || x + 1 == ref.getWidth())
				{
					// Don't check borders since the pixel neighborhood is undefined
					error.setPixel(x, y, tcu::RGBA(screenPixel.getRed(), (screenPixel.getGreen() + 255) / 2, screenPixel.getBlue(), 255));
					continue;
				}

				// Don't do comparisons for this pixel if it belongs to a one-pixel-thin part (i.e. it doesn't have similar-color neighbors in both x and y directions) in both result and reference.
				// This fixes some false negatives.
				bool		refThin			= (!tcu::compareThreshold(refPixel, ref.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(refPixel, ref.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(refPixel, ref.getPixel(x  , y+1), threshold));
				bool		screenThin		= (!tcu::compareThreshold(screenPixel, screen.getPixel(x-1, y  ), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x+1, y  ), threshold)) ||
											  (!tcu::compareThreshold(screenPixel, screen.getPixel(x  , y-1), threshold) && !tcu::compareThreshold(screenPixel, screen.getPixel(x  , y+1), threshold));

				if (refThin && screenThin)
					isOkPixel = true;
				else
				{
					for (int dy = -1; dy < 2 && !isOkPixel; dy++)
					{
						for (int dx = -1; dx < 2 && !isOkPixel; dx++)
						{
							// Check reference pixel against screen pixel
							{
								tcu::RGBA	screenCmpPixel	= screen.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refPixel.getRed()	- screenCmpPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refPixel.getGreen()	- screenCmpPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refPixel.getBlue()	- screenCmpPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}

							// Check screen pixels against reference pixel
							{
								tcu::RGBA	refCmpPixel		= ref.getPixel(x+dx, y+dy);
								deUint8		r				= (deUint8)deAbs32(refCmpPixel.getRed()		- screenPixel.getRed());
								deUint8		g				= (deUint8)deAbs32(refCmpPixel.getGreen()	- screenPixel.getGreen());
								deUint8		b				= (deUint8)deAbs32(refCmpPixel.getBlue()	- screenPixel.getBlue());

								if (r <= m_maxDiffRed && g <= m_maxDiffGreen && b <= m_maxDiffBlue)
									isOkPixel = true;
							}
						}
					}
				}

				if (isOkPixel)
					error.setPixel(x, y, tcu::RGBA(screen.getPixel(x, y).getRed(), (screen.getPixel(x, y).getGreen() + 255) / 2, screen.getPixel(x, y).getBlue(), 255));
				else
				{
					error.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					m_isOk = false;
				}
			}
		}

		tcu::TestLog& log = m_testCtx.getLog();
		if (!m_isOk)
		{
			log << TestLog::Message << "Image comparison failed, threshold = (" << m_maxDiffRed << ", " << m_maxDiffGreen << ", " << m_maxDiffBlue << ")" << TestLog::EndMessage;
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result",		"Result",		screen)
				<< TestLog::Image("Reference",	"Reference",	ref)
				<< TestLog::Image("ErrorMask",	"Error mask",	error)
				<< TestLog::EndImageSet;
		}
		else
		{
			log << TestLog::ImageSet("Compare result", "Result of rendering")
				<< TestLog::Image("Result", "Result", screen)
				<< TestLog::EndImageSet;
		}
	}
}